

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O1

bool __thiscall
r_exec::PTPX::build_mdl
          (PTPX *this,_Fact *cause,_Fact *consequent,GuardBuilder *guard_builder,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  _TPX *bm;
  ModelBase *this_00;
  Code *pCVar2;
  _TPX *this_01;
  bool bVar3;
  uint16_t write_index;
  P<r_code::Code> m0;
  uint16_t local_3a;
  value_type local_38;
  
  bm = (_TPX *)operator_new(0x38);
  this_01 = bm;
  BindingMap::BindingMap((BindingMap *)bm);
  LOCK();
  paVar1 = &(bm->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_38.object =
       &_TPX::build_mdl_head(this_01,(HLPBindingMap *)bm,0,cause,consequent,&local_3a)->
        super__Object;
  if ((Code *)local_38.object != (Code *)0x0) {
    LOCK();
    paVar1 = &((_Object *)&(local_38.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (*(guard_builder->super__Object)._vptr__Object[2])
            (guard_builder,local_38.object,0,cause,&local_3a);
  _TPX::build_mdl_tail(&this->super__TPX,(Code *)local_38.object,local_3a);
  this_00 = ModelBase::Get();
  pCVar2 = ModelBase::check_existence(this_00,(Code *)local_38.object);
  bVar3 = pCVar2 == (Code *)local_38.object;
  if (bVar3 && pCVar2 != (Code *)0x0) {
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
              (&(this->super__TPX).mdls,&local_38);
  }
  if ((Code *)local_38.object != (Code *)0x0) {
    LOCK();
    ((local_38.object)->refCount).super___atomic_base<long>._M_i =
         ((local_38.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_38.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*((_Object *)&(local_38.object)->_vptr__Object)->_vptr__Object[1])();
    }
  }
  LOCK();
  paVar1 = &(bm->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((bm->super_TPX).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
    (*(bm->super_TPX).super__Object._vptr__Object[1])(bm);
  }
  return bVar3 && pCVar2 != (Code *)0x0;
}

Assistant:

bool PTPX::build_mdl(_Fact *cause, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<BindingMap> bm = new BindingMap();
    uint16_t write_index;
    P<Code> m0 = build_mdl_head(bm, 0, cause, consequent, write_index);
    guard_builder->build(m0, nullptr, cause, write_index);
    build_mdl_tail(m0, write_index);
    Code *_m0 = ModelBase::Get()->check_existence(m0);

    if (_m0 == nullptr) {
        return false;
    } else if (_m0 == m0) {
        mdls.push_back(m0);
        return true;
    } else {
        return false;
    }
}